

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

void vkt::ssbo::anon_unknown_15::generateCompareSrc
               (ostream *src,char *resultVar,BufferLayout *bufferLayout,BufferBlock *block,
               int instanceNdx,BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath,
               MatrixLoadFlags matrixLoadFlag)

{
  BufferVar *var;
  anon_unknown_15 aVar1;
  VarTypeComponent VVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  anon_unknown_15 *this;
  char *__s;
  void *valuePtr;
  ostream *poVar6;
  size_t sVar7;
  int precision;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  int iVar9;
  undefined4 in_register_00000084;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  accessPath_00;
  BlockDataPtr *accessPath_01;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  MatrixLoadFlags in_stack_fffffffffffffef8;
  int iVar15;
  int local_104;
  int local_e0;
  undefined1 local_d8 [56];
  long local_a0;
  long local_98 [2];
  string shaderName;
  VarType curType;
  string apiName;
  
  end._M_current._4_4_ = in_register_00000084;
  end._M_current._0_4_ = instanceNdx;
  accessPath_00._M_current = end._M_current;
  accessPath_01 = blockPtr;
  glu::
  getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
            (&curType,(glu *)bufVar,*(VarType **)((long)&(bufVar->m_name).field_2 + 8),
             *(VarTypeComponent **)&bufVar->m_type,end);
  if (curType.m_type == TYPE_STRUCT) {
    iVar14 = (int)((ulong)(*(long *)(CONCAT44(curType.m_data.basic.precision,
                                              curType.m_data.basic.type) + 0x28) -
                          *(long *)(CONCAT44(curType.m_data.basic.precision,
                                             curType.m_data.basic.type) + 0x20)) >> 3) * -0x49249249
    ;
    if (0 < iVar14) {
      iVar3 = 0;
      do {
        glu::SubTypeAccess::member((SubTypeAccess *)local_d8,(SubTypeAccess *)bufVar,iVar3);
        generateCompareSrc(src,resultVar,bufferLayout,(BufferBlock *)((ulong)block & 0xffffffff),
                           instanceNdx,blockPtr,(BufferVar *)local_d8,(SubTypeAccess *)0x0,
                           in_stack_fffffffffffffef8);
        if ((void *)local_d8._24_8_ != (void *)0x0) {
          operator_delete((void *)local_d8._24_8_,local_d8._40_8_ - local_d8._24_8_);
        }
        glu::VarType::~VarType((VarType *)local_d8);
        iVar3 = iVar3 + 1;
      } while (iVar14 != iVar3);
    }
    goto LAB_0069cfef;
  }
  if (curType.m_type == TYPE_ARRAY) {
    uVar10 = curType.m_data.array.size;
    if (curType.m_data.array.size == -1) {
      uVar10 = *(int *)((long)&((bufferLayout[2].blocks.
                                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus +
                       (long)(int)block * 4);
    }
    if (0 < (int)uVar10) {
      iVar14 = 0;
      do {
        glu::SubTypeAccess::element((SubTypeAccess *)local_d8,(SubTypeAccess *)bufVar,iVar14);
        generateCompareSrc(src,resultVar,bufferLayout,(BufferBlock *)((ulong)block & 0xffffffff),
                           instanceNdx,blockPtr,(BufferVar *)local_d8,(SubTypeAccess *)0x0,
                           in_stack_fffffffffffffef8);
        if ((void *)local_d8._24_8_ != (void *)0x0) {
          operator_delete((void *)local_d8._24_8_,local_d8._40_8_ - local_d8._24_8_);
        }
        glu::VarType::~VarType((VarType *)local_d8);
        iVar14 = iVar14 + 1;
      } while (uVar10 != iVar14);
    }
    goto LAB_0069cfef;
  }
  var = (BufferVar *)((long)&(bufVar->m_name).field_2 + 8);
  ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
            (&apiName,(_anonymous_namespace_ *)bufferLayout,(BufferBlock *)blockPtr,var,
             (TypeComponentVector *)accessPath_00._M_current);
  iVar14 = BufferLayout::getVariableIndex((BufferLayout *)resultVar,&apiName);
  this = (anon_unknown_15 *)((long)iVar14 * 0x48 + *(long *)(resultVar + 0x18));
  ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
            (&shaderName,(_anonymous_namespace_ *)bufferLayout,
             (BufferBlock *)((ulong)block & 0xffffffff),(int)blockPtr,var,
             (TypeComponentVector *)accessPath_01);
  __s = glu::getDataTypeName(curType.m_data.basic.type);
  VVar2 = *end._M_current;
  iVar14 = computeOffset(this,*(BufferVarLayoutEntry **)((long)&(bufVar->m_name).field_2 + 8),
                         *(TypeComponentVector **)&bufVar->m_type);
  valuePtr = (void *)((long)iVar14 + (long)VVar2);
  if (curType.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
      curType.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
    if ((int)accessPath != 1) {
      std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
      std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
      std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
      if (__s == (char *)0x0) {
        std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
      }
      else {
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(src,__s,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (src,shaderName._M_dataplus._M_p,shaderName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      generateImmMatrixSrc
                (src,curType.m_data.basic.type,*(int *)(this + 0x34),(bool)this[0x40],valuePtr);
      goto LAB_0069cf99;
    }
    iVar14 = *(int *)(this + 0x34);
    aVar1 = this[0x40];
    local_d8._48_8_ = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_d8 + 0x30),shaderName._M_dataplus._M_p,
               shaderName._M_dataplus._M_p + shaderName._M_string_length);
    iVar3 = glu::getDataTypeMatrixNumRows(curType.m_data.basic.type);
    iVar4 = glu::getDataTypeMatrixNumColumns(curType.m_data.basic.type);
    if (0 < iVar4) {
      local_104 = 0;
      iVar15 = 0;
      iVar11 = 0;
      do {
        iVar13 = iVar15;
        if (0 < iVar3) {
          iVar9 = 0;
          iVar12 = local_104;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
            std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
            std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
            std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
            std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(src,"float",5);
            std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (src,(char *)local_d8._48_8_,local_a0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"][",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"], ",3);
            iVar5 = iVar15;
            if (aVar1 != (anon_unknown_15)0x0) {
              iVar5 = iVar12;
            }
            de::floatToString_abi_cxx11_
                      ((string *)local_d8,(de *)&DAT_00000001,
                       *(float *)((long)valuePtr + (long)iVar5),precision);
            std::__ostream_insert<char,std::char_traits<char>>
                      (src,(char *)local_d8._0_8_,local_d8._8_8_);
            if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>(src,");\n",3);
            iVar9 = iVar9 + 1;
            iVar15 = iVar15 + 4;
            iVar12 = iVar12 + iVar14;
          } while (iVar3 != iVar9);
        }
        iVar11 = iVar11 + 1;
        iVar15 = iVar13 + iVar14;
        local_104 = local_104 + 4;
      } while (iVar11 != iVar4);
      local_e0 = 0;
      local_104 = 0;
      iVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
        std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
        std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
        std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
        std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(src,"vec",3);
        poVar6 = (ostream *)std::ostream::operator<<(src,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_d8._48_8_,local_a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"], ",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec",3);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
        if (0 < iVar3) {
          iVar12 = 0;
          uVar8 = extraout_RDX;
          iVar11 = local_e0;
          iVar13 = local_104;
          do {
            iVar9 = iVar13;
            if (aVar1 != (anon_unknown_15)0x0) {
              iVar9 = iVar11;
            }
            de::floatToString_abi_cxx11_
                      ((string *)local_d8,(de *)&DAT_00000001,
                       *(float *)((long)valuePtr + (long)iVar9),(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (src,(char *)local_d8._0_8_,local_d8._8_8_);
            uVar8 = extraout_RDX_00;
            if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
              uVar8 = extraout_RDX_01;
            }
            if (iVar12 < iVar3 + -1) {
              std::__ostream_insert<char,std::char_traits<char>>(src,", ",2);
              uVar8 = extraout_RDX_02;
            }
            iVar12 = iVar12 + 1;
            iVar13 = iVar13 + 4;
            iVar11 = iVar11 + iVar14;
          } while (iVar3 != iVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>(src,"));\n",4);
        iVar15 = iVar15 + 1;
        local_104 = local_104 + iVar14;
        local_e0 = local_e0 + 4;
      } while (iVar15 != iVar4);
    }
    if ((long *)local_d8._48_8_ != local_98) {
      operator_delete((void *)local_d8._48_8_,local_98[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
    std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
    std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
    if (__s == (char *)0x0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(src,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (src,shaderName._M_dataplus._M_p,shaderName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    generateImmScalarVectorSrc(src,curType.m_data.basic.type,valuePtr);
LAB_0069cf99:
    std::__ostream_insert<char,std::char_traits<char>>(src,");\n",3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderName._M_dataplus._M_p != &shaderName.field_2) {
    operator_delete(shaderName._M_dataplus._M_p,shaderName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apiName._M_dataplus._M_p != &apiName.field_2) {
    operator_delete(apiName._M_dataplus._M_p,apiName.field_2._M_allocated_capacity + 1);
  }
LAB_0069cfef:
  glu::VarType::~VarType(&curType);
  return;
}

Assistant:

void generateCompareSrc (
	std::ostream&				src,
	const char*					resultVar,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath,
	MatrixLoadFlags				matrixLoadFlag)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx), LOAD_FULL_MATRIX);
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx), LOAD_FULL_MATRIX);
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const char*					typeName		= glu::getDataTypeName(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());


			if (isMatrix)
			{
				if (matrixLoadFlag == LOAD_MATRIX_COMPONENTS)
					generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr, resultVar, typeName, shaderName);
				else
				{
					src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
					generateImmMatrixSrc (src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
					src << ");\n";
				}
			}
			else
			{
				src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
				generateImmScalarVectorSrc(src, basicType, valuePtr);
				src << ");\n";
			}
		}
	}
}